

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgext(fitsfile *fptr,int hdunum,int *exttype,int *status)

{
  int iVar1;
  LONGLONG LVar2;
  int iVar3;
  int iVar4;
  int local_44;
  LONGLONG xheadend;
  int xmaxhdu;
  int xcurhdu;
  int *status_local;
  int *exttype_local;
  int hdunum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar3 = ffmbyt(fptr,fptr->Fptr->headstart[hdunum],0,status);
    if (iVar3 < 1) {
      iVar3 = fptr->Fptr->curhdu;
      iVar1 = fptr->Fptr->maxhdu;
      LVar2 = fptr->Fptr->headend;
      fptr->Fptr->curhdu = hdunum;
      fptr->HDUposition = hdunum;
      local_44 = hdunum;
      if (hdunum < fptr->Fptr->maxhdu) {
        local_44 = fptr->Fptr->maxhdu;
      }
      fptr->Fptr->maxhdu = local_44;
      fptr->Fptr->headend = fptr->Fptr->logfilesize;
      iVar4 = ffrhdu(fptr,exttype,status);
      if (0 < iVar4) {
        fptr->Fptr->curhdu = iVar3;
        fptr->HDUposition = iVar3;
        fptr->Fptr->maxhdu = iVar1;
        fptr->Fptr->headend = LVar2;
      }
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgext(fitsfile *fptr,      /* I - FITS file pointer                */
           int hdunum,          /* I - no. of HDU to move get (0 based) */ 
           int *exttype,        /* O - type of extension, 0, 1, or 2    */
           int *status)         /* IO - error status                    */
/*
  Get Extension.  Move to the specified extension and initialize the
  HDU structure.
*/
{
    int xcurhdu, xmaxhdu;
    LONGLONG xheadend;

    if (*status > 0)
        return(*status);

    if (ffmbyt(fptr, (fptr->Fptr)->headstart[hdunum], REPORT_EOF, status) <= 0)
    {
        /* temporarily save current values, in case of error */
        xcurhdu = (fptr->Fptr)->curhdu;
        xmaxhdu = (fptr->Fptr)->maxhdu;
        xheadend = (fptr->Fptr)->headend;

        /* set new parameter values */
        (fptr->Fptr)->curhdu = hdunum;
        fptr->HDUposition    = hdunum;
        (fptr->Fptr)->maxhdu = maxvalue((fptr->Fptr)->maxhdu, hdunum);
        (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize; /* set max size */

        if (ffrhdu(fptr, exttype, status) > 0)
        {   /* failed to get the new HDU, so restore previous values */
            (fptr->Fptr)->curhdu = xcurhdu;
            fptr->HDUposition    = xcurhdu;
            (fptr->Fptr)->maxhdu = xmaxhdu;
            (fptr->Fptr)->headend = xheadend;
        }
    }
    return(*status);
}